

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O3

void __thiscall QtMWidgets::DateTimeParser::DateTimeParser(DateTimeParser *this,Type t)

{
  QByteArrayView QVar1;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  this->_vptr_DateTimeParser = (_func_int **)&PTR__DateTimeParser_0019ebb8;
  (this->sections).d.d = (Data *)0x0;
  (this->sections).d.ptr = (Section *)0x0;
  (this->sections).d.size = 0;
  this->type = t;
  (this->format).d.d = (Data *)0x0;
  (this->format).d.ptr = (char16_t *)0x0;
  (this->format).d.size = 0;
  QVar1.m_data = (storage_type *)0x14;
  QVar1.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar1);
  local_58.d.d = (Data *)local_38;
  local_58.d.ptr = pcStack_30;
  local_58.d.size = local_28;
  parseFormat(this,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

DateTimeParser::DateTimeParser( QMetaType::Type t )
	:	type( t )
{
	parseFormat( QLatin1String( "dddd MMMM yyyy hh mm" ) );
}